

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chi_square_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::chi_square_dist<float>::icdf(chi_square_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  chi_square_dist<float> *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  if ((in_XMM0_Da <= 0.0) || (1.0 <= in_XMM0_Da)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_4 = std::numeric_limits<float>::quiet_NaN();
  }
  else if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
      local_4 = icdf_(in_RDI,in_stack_ffffffffffffffdc);
    }
    else {
      local_4 = std::numeric_limits<float>::infinity();
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return icdf_(x);
    }